

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

xmlParserErrors
xmllintResourceLoader
          (void *ctxt,char *URL,char *ID,xmlResourceType type,xmlParserInputFlags flags,
          xmlParserInputPtr *out)

{
  undefined8 uVar1;
  long lVar2;
  char *local_90;
  char *local_78;
  xmlChar *newURL;
  char *iter;
  char *lastsegment;
  int i;
  xmlParserErrors code;
  xmllintState *lint;
  xmlParserInputPtr *out_local;
  xmlParserInputFlags flags_local;
  xmlResourceType type_local;
  char *ID_local;
  char *URL_local;
  void *ctxt_local;
  
  iter = URL;
  if ((0 < *(int *)((long)ctxt + 0x338)) && (newURL = (xmlChar *)URL, URL != (char *)0x0)) {
    for (; *newURL != '\0'; newURL = newURL + 1) {
      if (*newURL == '/') {
        iter = (char *)(newURL + 1);
      }
    }
  }
  if (*(long *)((long)ctxt + 0x10) == 0) {
    lastsegment._4_4_ = xmlNewInputFromUrl(URL,flags,out);
  }
  else {
    lastsegment._4_4_ = (**(code **)((long)ctxt + 0x10))(0,URL,ID,type,flags,out);
  }
  if (lastsegment._4_4_ == XML_IO_ENOENT) {
    for (lastsegment._0_4_ = 0; (int)lastsegment < *(int *)((long)ctxt + 0x338);
        lastsegment._0_4_ = (int)lastsegment + 1) {
      uVar1 = xmlStrdup(*(undefined8 *)((long)ctxt + (long)(int)lastsegment * 8 + 0x130));
      uVar1 = xmlStrcat(uVar1,"/");
      lVar2 = xmlStrcat(uVar1,iter);
      if (lVar2 != 0) {
        if (*(long *)((long)ctxt + 0x10) == 0) {
          lastsegment._4_4_ = xmlNewInputFromUrl(lVar2,flags,out);
        }
        else {
          lastsegment._4_4_ = (**(code **)((long)ctxt + 0x10))(0,lVar2,ID,type,flags,out);
        }
        if (lastsegment._4_4_ != XML_IO_ENOENT) {
          if ((*(int *)((long)ctxt + 0x33c) != 0) && (lastsegment._4_4_ == XML_ERR_OK)) {
            local_90 = ID;
            if (ID == (char *)0x0) {
              local_90 = "(null)";
            }
            fprintf(*ctxt,"Loaded URL=\"%s\" ID=\"%s\"\n",lVar2,local_90);
          }
          (*_xmlFree)(lVar2);
          return lastsegment._4_4_;
        }
        (*_xmlFree)(lVar2);
      }
    }
    ctxt_local._4_4_ = XML_IO_ENOENT;
  }
  else {
    if ((*(int *)((long)ctxt + 0x33c) != 0) && (lastsegment._4_4_ == XML_ERR_OK)) {
      local_78 = ID;
      if (ID == (char *)0x0) {
        local_78 = "(null)";
      }
      fprintf(*ctxt,"Loaded URL=\"%s\" ID=\"%s\"\n",URL,local_78);
    }
    ctxt_local._4_4_ = lastsegment._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static xmlParserErrors
xmllintResourceLoader(void *ctxt, const char *URL,
                      const char *ID, xmlResourceType type,
                      xmlParserInputFlags flags, xmlParserInputPtr *out) {
    xmllintState *lint = ctxt;
    xmlParserErrors code;
    int i;
    const char *lastsegment = URL;
    const char *iter = URL;

    if ((lint->nbpaths > 0) && (iter != NULL)) {
	while (*iter != 0) {
	    if (*iter == '/')
		lastsegment = iter + 1;
	    iter++;
	}
    }

    if (lint->defaultResourceLoader != NULL)
        code = lint->defaultResourceLoader(NULL, URL, ID, type, flags, out);
    else
        code = xmlNewInputFromUrl(URL, flags, out);
    if (code != XML_IO_ENOENT) {
        if ((lint->load_trace) && (code == XML_ERR_OK)) {
            fprintf(lint->errStream, "Loaded URL=\"%s\" ID=\"%s\"\n",
                    URL, ID ? ID : "(null)");
        }
        return(code);
    }

    for (i = 0; i < lint->nbpaths; i++) {
	xmlChar *newURL;

	newURL = xmlStrdup((const xmlChar *) lint->paths[i]);
	newURL = xmlStrcat(newURL, (const xmlChar *) "/");
	newURL = xmlStrcat(newURL, (const xmlChar *) lastsegment);
	if (newURL != NULL) {
            if (lint->defaultResourceLoader != NULL)
                code = lint->defaultResourceLoader(NULL, (const char *) newURL,
                                                   ID, type, flags, out);
            else
                code = xmlNewInputFromUrl((const char *) newURL, flags, out);
            if (code != XML_IO_ENOENT) {
                if ((lint->load_trace) && (code == XML_ERR_OK)) {
                    fprintf(lint->errStream, "Loaded URL=\"%s\" ID=\"%s\"\n",
                            newURL, ID ? ID : "(null)");
                }
	        xmlFree(newURL);
                return(code);
            }
	    xmlFree(newURL);
	}
    }

    return(XML_IO_ENOENT);
}